

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnRefNullExpr(BinaryReaderIR *this,Type type)

{
  bool bVar1;
  Type local_38;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_30;
  Type local_28;
  BinaryReaderIR *local_20;
  BinaryReaderIR *this_local;
  Type type_local;
  
  local_28 = type;
  local_20 = this;
  unique0x100000f5 = type;
  bVar1 = wabt::operator==(type,ExnRef);
  (this->module_->features_used).exceptions =
       ((this->module_->features_used).exceptions & 1U) != 0 || bVar1;
  std::make_unique<wabt::RefTypeExpr<(wabt::ExprType)37>,wabt::Type&>(&local_38);
  std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
  unique_ptr<wabt::RefTypeExpr<(wabt::ExprType)37>,std::default_delete<wabt::RefTypeExpr<(wabt::ExprType)37>>,void>
            ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)&local_30,
             (unique_ptr<wabt::RefTypeExpr<(wabt::ExprType)37>,_std::default_delete<wabt::RefTypeExpr<(wabt::ExprType)37>_>_>
              *)&local_38);
  type_local.enum_ = (Enum)AppendExpr(this,&local_30);
  std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_30);
  std::
  unique_ptr<wabt::RefTypeExpr<(wabt::ExprType)37>,_std::default_delete<wabt::RefTypeExpr<(wabt::ExprType)37>_>_>
  ::~unique_ptr((unique_ptr<wabt::RefTypeExpr<(wabt::ExprType)37>,_std::default_delete<wabt::RefTypeExpr<(wabt::ExprType)37>_>_>
                 *)&local_38);
  return (Result)type_local.enum_;
}

Assistant:

Result BinaryReaderIR::OnRefNullExpr(Type type) {
  module_->features_used.exceptions |= (type == Type::ExnRef);
  return AppendExpr(std::make_unique<RefNullExpr>(type));
}